

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SaveIniSettingsToDisk(char *ini_filename)

{
  ImGuiSettingsHandler *pIVar1;
  ImGuiContext *pIVar2;
  FILE *__s;
  int rhs_size;
  long lVar3;
  long lVar4;
  ImVector<char> buf;
  ImGuiTextBuffer local_58;
  undefined8 local_48;
  char *pcStack_40;
  
  pIVar2 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  if (ini_filename != (char *)0x0) {
    local_48 = 0;
    pcStack_40 = (char *)0x0;
    pIVar2->SettingsDirtyTimer = 0.0;
    ImGuiTextBuffer::ImGuiTextBuffer(&local_58);
    if (0 < (pIVar2->SettingsHandlers).Size) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        pIVar1 = (pIVar2->SettingsHandlers).Data;
        (**(code **)((long)&pIVar1->WriteAllFn + lVar3))
                  (pIVar2,(long)&pIVar1->TypeName + lVar3,&local_58);
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x30;
      } while (lVar4 < (pIVar2->SettingsHandlers).Size);
    }
    if (local_58.Buf.Size < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                    ,0x4b9,"void ImVector<char>::pop_back() [T = char]");
    }
    local_48 = CONCAT44(local_58.Buf.Capacity,local_58.Buf.Size - 1U);
    pcStack_40 = local_58.Buf.Data;
    __s = fopen(ini_filename,"wt");
    if (__s != (FILE *)0x0) {
      fwrite(local_58.Buf.Data,1,(ulong)(local_58.Buf.Size - 1U),__s);
      fclose(__s);
    }
    if (local_58.Buf.Data != (char *)0x0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(local_58.Buf.Data,GImAllocatorUserData);
    }
  }
  return;
}

Assistant:

static void SaveIniSettingsToDisk(const char* ini_filename)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    if (!ini_filename)
        return;

    ImVector<char> buf;
    SaveIniSettingsToMemory(buf);

    FILE* f = ImFileOpen(ini_filename, "wt");
    if (!f)
        return;
    fwrite(buf.Data, sizeof(char), (size_t)buf.Size, f);
    fclose(f);
}